

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O0

bool __thiscall tcu::Interval::operator==(Interval *this,Interval *other)

{
  bool bVar1;
  bool local_2a;
  Interval *other_local;
  Interval *this_local;
  
  if ((this->m_hasNaN & 1U) != (other->m_hasNaN & 1U)) {
    return false;
  }
  bVar1 = empty(this);
  if ((bVar1) && (bVar1 = empty(other), bVar1)) {
    return true;
  }
  local_2a = false;
  if ((this->m_lo == other->m_lo) && (!NAN(this->m_lo) && !NAN(other->m_lo))) {
    local_2a = this->m_hi == other->m_hi;
  }
  return local_2a;
}

Assistant:

bool		operator==		(const Interval& other) const
	{
		return ((m_hasNaN == other.m_hasNaN) &&
				((empty() && other.empty()) ||
				 (m_lo == other.m_lo && m_hi == other.m_hi)));
	}